

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall polyscope::Group::addChildGroup(Group *this,Group *newChild)

{
  Group *pGVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cullExpiredChildren(this);
  unparent(newChild);
  pGVar1 = getTopLevelGrandparent(this);
  if (pGVar1 == newChild) {
    std::operator+(&local_38,"Attempted to make group ",&newChild->name);
    std::operator+(&local_f8,&local_38," a child of ");
    std::operator+(&local_d8,&local_f8,&this->name);
    std::operator+(&local_b8,&local_d8,", but this would create a cycle (group ");
    std::operator+(&local_98,&local_b8,&this->name);
    std::operator+(&local_78,&local_98," is already a descendant of ");
    std::operator+(&bStack_118,&local_78,&newChild->name);
    std::operator+(&local_58,&bStack_118,")");
    exception(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_118);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    WeakReferrable::getWeakHandle<polyscope::Group>
              ((WeakHandle<polyscope::Group> *)&bStack_118,
               (WeakReferrable *)((long)&this->_vptr_Group + (long)this->_vptr_Group[-3]),
               (Group *)0x0);
    WeakHandle<polyscope::Group>::operator=
              (&newChild->parentGroup,(WeakHandle<polyscope::Group> *)&bStack_118);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_118._M_string_length);
    WeakReferrable::getWeakHandle<polyscope::Group>
              ((WeakHandle<polyscope::Group> *)&bStack_118,
               (WeakReferrable *)((long)&newChild->_vptr_Group + (long)newChild->_vptr_Group[-3]),
               (Group *)0x0);
    std::
    vector<polyscope::WeakHandle<polyscope::Group>,std::allocator<polyscope::WeakHandle<polyscope::Group>>>
    ::emplace_back<polyscope::WeakHandle<polyscope::Group>>
              ((vector<polyscope::WeakHandle<polyscope::Group>,std::allocator<polyscope::WeakHandle<polyscope::Group>>>
                *)&this->childrenGroups,(WeakHandle<polyscope::Group> *)&bStack_118);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_118._M_string_length);
  }
  return;
}

Assistant:

void Group::addChildGroup(Group& newChild) {
  cullExpiredChildren();

  // if child is already in a group, remove it from that group
  newChild.unparent();

  if (getTopLevelGrandparent() == &newChild) {
    exception("Attempted to make group " + newChild.name + " a child of " + name +
              ", but this would create a cycle (group " + name + " is already a descendant of " + newChild.name + ")");
    return;
  }

  // assign to the new group
  newChild.parentGroup = this->getWeakHandle<Group>(); // we want a weak pointer to the shared ptr
  childrenGroups.push_back(newChild.getWeakHandle<Group>());
}